

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O0

void dmrC_dump_macro_definitions(dmr_C *C)

{
  symbol *sym_00;
  symbol *sym;
  ptr_list_iter nameiter__;
  ident *name;
  dmr_C *C_local;
  
  ptrlist_forward_iterator((ptr_list_iter *)&sym,(ptr_list *)C->macros);
  nameiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&sym);
  while (nameiter__._16_8_ != 0) {
    sym_00 = lookup_macro(C,(ident *)nameiter__._16_8_);
    if (sym_00 != (symbol *)0x0) {
      dump_macro(C,sym_00);
    }
    nameiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&sym);
  }
  return;
}

Assistant:

void dmrC_dump_macro_definitions(struct dmr_C *C)
{
	struct ident *name;

	FOR_EACH_PTR(C->macros, name) {
		struct symbol *sym = lookup_macro(C, name);
		if (sym)
			dump_macro(C, sym);
	} END_FOR_EACH_PTR(name);
}